

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O2

vector3_base<int> * allocator_default<vector3_base<int>_>::alloc_array(int size)

{
  undefined1 auVar1 [16];
  vector3_base<int> *pvVar2;
  ulong uVar3;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)size;
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
    uVar3 = SUB168(auVar1 * ZEXT816(0xc),0);
  }
  pvVar2 = (vector3_base<int> *)operator_new__(uVar3);
  return pvVar2;
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }